

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi_loadf_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  float *pfVar1;
  undefined1 local_118 [8];
  stbi__context s;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  int len_local;
  stbi_uc *buffer_local;
  
  s.img_buffer_original_end._4_4_ = req_comp;
  stbi__start_mem((stbi__context *)local_118,buffer,len);
  pfVar1 = stbi__loadf_main((stbi__context *)local_118,x,y,comp,s.img_buffer_original_end._4_4_);
  return pfVar1;
}

Assistant:

STBIDEF float *stbi_loadf_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__loadf_main(&s,x,y,comp,req_comp);
}